

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

segment_t *
kiste::parse_expression(segment_t *__return_storage_ptr__,string *line,segment_type type,size_t pos)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  parse_error *this;
  int local_4c;
  string local_48 [4];
  int arg_curly_level;
  string expression;
  size_t pos_local;
  segment_type type_local;
  string *line_local;
  
  expression.field_2._8_8_ = pos;
  std::__cxx11::string::string(local_48);
  local_4c = 1;
  for (; uVar1 = expression.field_2._8_8_, uVar2 = std::__cxx11::string::size(),
      (ulong)uVar1 < uVar2 && local_4c != 0; expression.field_2._8_8_ = expression.field_2._8_8_ + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)line);
    if (*pcVar3 == '{') {
      local_4c = local_4c + 1;
      std::__cxx11::string::at((ulong)line);
      std::__cxx11::string::push_back((char)local_48);
    }
    else if (*pcVar3 == '}') {
      local_4c = local_4c + -1;
      if (local_4c != 0) {
        std::__cxx11::string::at((ulong)line);
        std::__cxx11::string::push_back((char)local_48);
      }
    }
    else {
      std::__cxx11::string::at((ulong)line);
      std::__cxx11::string::push_back((char)local_48);
    }
  }
  if (0 < local_4c) {
    this = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this,"missing closing brace");
    __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
  }
  expression.field_2._8_8_ = expression.field_2._8_8_ - 1;
  __return_storage_ptr__->_end_pos = expression.field_2._8_8_;
  __return_storage_ptr__->_type = type;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->_text,local_48);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

auto parse_expression(const std::string& line, segment_type type, std::size_t pos) -> segment_t
  {
    auto expression = std::string{};
    auto arg_curly_level = 1;

    for (; pos < line.size() and arg_curly_level; ++pos)
    {
      switch (line.at(pos))
      {
      case '{':
        ++arg_curly_level;
        expression.push_back(line.at(pos));
        break;
      case '}':
        --arg_curly_level;
        if (arg_curly_level)
        {
          expression.push_back(line.at(pos));
        }
        else
        {
          // do nothing, as this probably the closing curly brace of the command
        }
        break;
      default:
        expression.push_back(line.at(pos));
      }
    }
    if (arg_curly_level > 0)
    {
      throw parse_error("missing closing brace");
    }
    --pos;

    return {pos, type, expression};
  }